

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool operator_string_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  int iVar2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_class_t *pgVar4;
  gravity_string_t *s1;
  gravity_value_t value;
  gravity_value_t gVar5;
  char _buffer [4096];
  char local_1028 [4096];
  
  pgVar1 = (args->field_1).p;
  gVar5 = convert_value2string(vm,args[1]);
  pgVar4 = gravity_class_int;
  if (gVar5.isa == (gravity_class_t *)0x0) {
    builtin_strncpy(local_1028,"Unable to convert object to String",0x23);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    aVar3.n = 0;
    pgVar4 = gravity_class_null;
  }
  else {
    iVar2 = strcmp((char *)pgVar1->objclass,(char *)(gVar5.field_1.p)->objclass);
    aVar3 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)iVar2;
  }
  value.field_1.n = aVar3.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return gVar5.isa != (gravity_class_t *)0x0;
}

Assistant:

static bool operator_string_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    if (VALUE_ISA_VALID(v2)) {
        gravity_string_t *s1 = VALUE_AS_STRING(v1);
        gravity_string_t *s2 = VALUE_AS_STRING(v2);
        RETURN_VALUE(VALUE_FROM_INT(strcmp(s1->s, s2->s)), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}